

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSolve.cpp
# Opt level: O2

HighsStatus solveLp(HighsLpSolverObject *solver_object,string *message)

{
  string *psVar1;
  HighsLogOptions *log_options_;
  HighsModelStatus HVar2;
  HighsOptions *options;
  HighsInfo *pHVar3;
  HighsLogOptions *pHVar4;
  __type _Var5;
  bool bVar6;
  HighsStatus HVar7;
  HighsInt HVar8;
  HighsStatus HVar9;
  HighsDebugStatus HVar10;
  string *psVar11;
  char *pcVar12;
  char *pcVar13;
  double dVar14;
  double dVar15;
  allocator local_2b9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  string *local_298;
  string local_290;
  HighsLogOptions local_270;
  HighsLogOptions local_210;
  HighsLogOptions local_1b0;
  HighsLogOptions local_150;
  HighsLogOptions local_f0;
  HighsLogOptions local_90;
  
  options = solver_object->options_;
  resetModelStatusAndHighsInfo(solver_object);
  log_options_ = &(options->super_HighsOptionsStruct).log_options;
  local_298 = message;
  std::operator+(&local_2b8,message,"\n");
  HVar7 = kOk;
  highsLogUser(log_options_,kInfo,local_2b8._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&local_2b8);
  if (0 < (options->super_HighsOptionsStruct).highs_debug_level) {
    HVar7 = assessLp(solver_object->lp_,options);
    HighsLogOptions::HighsLogOptions(&local_90,log_options_);
    std::__cxx11::string::string((string *)&local_2b8,"assessLp",&local_2b9);
    HVar7 = interpretCallStatus(&local_90,HVar7,kOk,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::_Function_base::~_Function_base(&local_90.user_callback.super__Function_base);
    if (HVar7 == kError) {
      return kError;
    }
  }
  if ((solver_object->lp_->num_row_ == 0) ||
     (HVar8 = HighsSparseMatrix::numNz(&solver_object->lp_->a_matrix_), HVar8 == 0)) {
    HVar9 = solveUnconstrainedLp(solver_object);
    HighsLogOptions::HighsLogOptions(&local_f0,log_options_);
    std::__cxx11::string::string((string *)&local_2b8,"solveUnconstrainedLp",&local_2b9);
    HVar7 = interpretCallStatus(&local_f0,HVar9,HVar7,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    std::_Function_base::~_Function_base(&local_f0.user_callback.super__Function_base);
    if (HVar7 == kError) {
      return kError;
    }
    goto LAB_00272831;
  }
  psVar1 = &(options->super_HighsOptionsStruct).solver;
  _Var5 = std::operator==(psVar1,&kIpmString_abi_cxx11_);
  if (((_Var5) || ((options->super_HighsOptionsStruct).run_centring != false)) ||
     (_Var5 = std::operator==(psVar1,&kPdlpString_abi_cxx11_), _Var5)) {
    _Var5 = std::operator==(psVar1,&kIpmString_abi_cxx11_);
    if ((_Var5) || ((options->super_HighsOptionsStruct).run_centring == true)) {
      HVar9 = solveLpIpx(solver_object);
      HighsLogOptions::HighsLogOptions(&local_150,log_options_);
      std::__cxx11::string::string((string *)&local_2b8,"solveLpIpx",&local_2b9);
      HVar7 = interpretCallStatus(&local_150,HVar9,HVar7,&local_2b8);
      pHVar4 = &local_150;
    }
    else {
      HVar9 = solveLpCupdlp(solver_object);
      HighsLogOptions::HighsLogOptions(&local_1b0,log_options_);
      std::__cxx11::string::string((string *)&local_2b8,"solveLpCupdlp",&local_2b9);
      HVar7 = interpretCallStatus(&local_1b0,HVar9,HVar7,&local_2b8);
      pHVar4 = &local_1b0;
    }
    std::__cxx11::string::~string((string *)&local_2b8);
    std::_Function_base::~_Function_base(&(pHVar4->user_callback).super__Function_base);
    if (HVar7 == kError) {
      return kError;
    }
    correctResiduals(solver_object);
    dVar14 = HighsLp::objectiveValue(solver_object->lp_,&solver_object->solution_->col_value);
    pHVar3 = solver_object->highs_info_;
    (pHVar3->super_HighsInfoStruct).objective_function_value = dVar14;
    getLpKktFailures(options,solver_object->lp_,solver_object->solution_,solver_object->basis_,
                     pHVar3);
    if ((solver_object->model_status_ == kOptimal) &&
       ((0 < (solver_object->highs_info_->super_HighsInfoStruct).num_primal_infeasibilities ||
        ((solver_object->highs_info_->super_HighsInfoStruct).num_dual_infeasibilities != 0)))) {
      solver_object->model_status_ = kUnknown;
    }
    _Var5 = std::operator==(psVar1,&kIpmString_abi_cxx11_);
    if ((!_Var5) && ((options->super_HighsOptionsStruct).run_centring != true)) {
      pHVar3 = solver_object->highs_info_;
      if (solver_object->model_status_ == kUnboundedOrInfeasible) {
        if ((pHVar3->super_HighsInfoStruct).num_primal_infeasibilities != 0) goto LAB_00272831;
        HVar2 = kUnbounded;
      }
      else {
        if (solver_object->model_status_ != kOptimal) goto LAB_00272831;
        if ((pHVar3->super_HighsInfoStruct).num_primal_infeasibilities == 0) {
          if ((pHVar3->super_HighsInfoStruct).num_dual_infeasibilities == 0) goto LAB_00272831;
          dVar14 = (pHVar3->super_HighsInfoStruct).max_dual_infeasibility;
          dVar15 = (pHVar3->super_HighsInfoStruct).sum_dual_infeasibilities;
          pcVar12 = 
          "PDLP claims optimality, but with num/max/sum %d / %9.4g / %9.4g dual infeasibilities\n";
        }
        else {
          dVar14 = (pHVar3->super_HighsInfoStruct).max_primal_infeasibility;
          dVar15 = (pHVar3->super_HighsInfoStruct).sum_primal_infeasibilities;
          pcVar12 = 
          "PDLP claims optimality, but with num/max/sum %d / %9.4g / %9.4g primal infeasibilities\n"
          ;
        }
        highsLogUser(log_options_,kWarning,pcVar12,dVar14,dVar15);
        highsLogUser(log_options_,kWarning,
                     "                        and          max/sum     %9.4g / %9.4g complementarity violations\n"
                     ,(pHVar3->super_HighsInfoStruct).max_complementarity_violation,
                     (pHVar3->super_HighsInfoStruct).sum_complementarity_violations);
        highsLogUser(log_options_,kWarning,
                     "                        so set model status to \"unknown\"\n");
        HVar2 = kUnknown;
      }
      solver_object->model_status_ = HVar2;
      goto LAB_00272831;
    }
    HVar2 = solver_object->model_status_;
    if ((HVar2 != kUnknown) &&
       ((HVar2 != kUnboundedOrInfeasible ||
        ((options->super_HighsOptionsStruct).allow_unbounded_or_infeasible != false))))
    goto LAB_00272831;
    utilModelStatusToString_abi_cxx11_(&local_2b8,HVar2);
    pcVar13 = "not ";
    pcVar12 = "not ";
    if (solver_object->basis_->valid != false) {
      pcVar12 = "";
    }
    if (solver_object->solution_->value_valid != false) {
      pcVar13 = "";
    }
    psVar1 = &(options->super_HighsOptionsStruct).run_crossover;
    psVar11 = &kHighsOffString_abi_cxx11_;
    if ((options->super_HighsOptionsStruct).run_centring == false) {
      psVar11 = psVar1;
    }
    highsLogUser(log_options_,kWarning,
                 "Unwelcome IPX status of %s: basis is %svalid; solution is %svalid; run_crossover is \"%s\"\n"
                 ,local_2b8._M_dataplus._M_p,pcVar12,pcVar13,(psVar11->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&local_2b8);
    bVar6 = std::operator!=(psVar1,&kHighsOffString_abi_cxx11_);
    if ((!bVar6) || ((options->super_HighsOptionsStruct).run_centring != false)) goto LAB_00272831;
    highsLogUser(log_options_,kWarning,"IPX solution is imprecise, so clean up with simplex\n");
    HVar7 = solveLpSimplex(solver_object);
    HighsLogOptions::HighsLogOptions(&local_210,log_options_);
    std::__cxx11::string::string((string *)&local_2b8,"solveLpSimplex",&local_2b9);
    HVar7 = interpretCallStatus(&local_210,HVar7,kOk,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    pHVar4 = &local_210;
  }
  else {
    HVar9 = solveLpSimplex(solver_object);
    HighsLogOptions::HighsLogOptions(&local_270,log_options_);
    std::__cxx11::string::string((string *)&local_2b8,"solveLpSimplex",&local_2b9);
    HVar7 = interpretCallStatus(&local_270,HVar9,HVar7,&local_2b8);
    std::__cxx11::string::~string((string *)&local_2b8);
    pHVar4 = &local_270;
  }
  std::_Function_base::~_Function_base(&(pHVar4->user_callback).super__Function_base);
  if (HVar7 == kError) {
    return kError;
  }
  bVar6 = isSolutionRightSize(solver_object->lp_,solver_object->solution_);
  if (!bVar6) {
    highsLogUser(log_options_,kError,"Inconsistent solution returned from solver\n");
    return kError;
  }
LAB_00272831:
  std::__cxx11::string::string((string *)&local_290,(string *)local_298);
  HVar10 = debugHighsLpSolution(&local_290,solver_object);
  std::__cxx11::string::~string((string *)&local_290);
  if (HVar10 == kLogicalError) {
    HVar7 = kError;
  }
  return HVar7;
}

Assistant:

HighsStatus solveLp(HighsLpSolverObject& solver_object, const string message) {
  HighsStatus return_status = HighsStatus::kOk;
  HighsStatus call_status;
  HighsOptions& options = solver_object.options_;
  // Reset unscaled model status and solution params - except for
  // iteration counts
  resetModelStatusAndHighsInfo(solver_object);
  highsLogUser(options.log_options, HighsLogType::kInfo,
               (message + "\n").c_str());
  if (options.highs_debug_level > kHighsDebugLevelMin) {
    // Shouldn't have to check validity of the LP since this is done when it is
    // loaded or modified
    call_status = assessLp(solver_object.lp_, options);
    // If any errors have been found or normalisation carried out,
    // call_status will be ERROR or WARNING, so only valid return is OK.
    assert(call_status == HighsStatus::kOk);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "assessLp");
    if (return_status == HighsStatus::kError) return return_status;
  }
  if (!solver_object.lp_.num_row_ || solver_object.lp_.a_matrix_.numNz() == 0) {
    // LP is unconstrained due to having no rows or a zero constraint
    // matrix, so solve directly
    call_status = solveUnconstrainedLp(solver_object);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "solveUnconstrainedLp");
    if (return_status == HighsStatus::kError) return return_status;
  } else if (options.solver == kIpmString || options.run_centring ||
             options.solver == kPdlpString) {
    // Use IPM or PDLP
    if (options.solver == kIpmString || options.run_centring) {
      // Use IPX to solve the LP
      try {
        call_status = solveLpIpx(solver_object);
      } catch (const std::exception& exception) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Exception %s in solveLpIpx\n", exception.what());
        call_status = HighsStatus::kError;
      }
      return_status = interpretCallStatus(options.log_options, call_status,
                                          return_status, "solveLpIpx");
    } else {
      // Use cuPDLP-C to solve the LP
      try {
        call_status = solveLpCupdlp(solver_object);
      } catch (const std::exception& exception) {
        highsLogDev(options.log_options, HighsLogType::kError,
                    "Exception %s in solveLpCupdlp\n", exception.what());
        call_status = HighsStatus::kError;
      }
      return_status = interpretCallStatus(options.log_options, call_status,
                                          return_status, "solveLpCupdlp");
    }
    if (return_status == HighsStatus::kError) return return_status;
    // IPM (and PDLP?) can claim optimality with large primal and/or
    // dual residual errors, so must correct any residual errors that
    // exceed the tolerance in this scenario.
    //
    // OK to correct residual errors whatever the model status, as
    // it's only changed in the case of optimality
    correctResiduals(solver_object);

    // Non-error return requires a primal solution
    assert(solver_object.solution_.value_valid);
    // Get the objective and any KKT failures
    solver_object.highs_info_.objective_function_value =
        solver_object.lp_.objectiveValue(solver_object.solution_.col_value);
    getLpKktFailures(options, solver_object.lp_, solver_object.solution_,
                     solver_object.basis_, solver_object.highs_info_);
    if (solver_object.model_status_ == HighsModelStatus::kOptimal &&
        (solver_object.highs_info_.num_primal_infeasibilities > 0 ||
         solver_object.highs_info_.num_dual_infeasibilities))
      solver_object.model_status_ = HighsModelStatus::kUnknown;
    if (options.solver == kIpmString || options.run_centring) {
      // Setting the IPM-specific values of (highs_)info_ has been done in
      // solveLpIpx
      const bool unwelcome_ipx_status =
          solver_object.model_status_ == HighsModelStatus::kUnknown ||
          (solver_object.model_status_ ==
               HighsModelStatus::kUnboundedOrInfeasible &&
           !options.allow_unbounded_or_infeasible);
      if (unwelcome_ipx_status) {
        // When performing an analytic centre calculation, the setting
        // of options.run_crossover is ignored, so simplex clean-up is
        // not possible - or desirable, anyway!
        highsLogUser(
            options.log_options, HighsLogType::kWarning,
            "Unwelcome IPX status of %s: basis is %svalid; solution is "
            "%svalid; run_crossover is \"%s\"\n",
            utilModelStatusToString(solver_object.model_status_).c_str(),
            solver_object.basis_.valid ? "" : "not ",
            solver_object.solution_.value_valid ? "" : "not ",
            options.run_centring ? kHighsOffString.c_str()
                                 : options.run_crossover.c_str());
        const bool allow_simplex_cleanup =
            options.run_crossover != kHighsOffString && !options.run_centring;
        if (allow_simplex_cleanup) {
          // IPX has returned a model status that HiGHS would rather
          // avoid, so perform simplex clean-up if crossover was allowed.
          //
          // This is an unusual situation, and the cost will usually be
          // acceptable. Worst case is if crossover wasn't run, in which
          // case there's no basis to start simplex
          //
          // ToDo: Check whether simplex can exploit the primal solution
          // returned by IPX
          highsLogUser(options.log_options, HighsLogType::kWarning,
                       "IPX solution is imprecise, so clean up with simplex\n");
          // Reset the return status since it will now be determined by
          // the outcome of the simplex solve
          return_status = HighsStatus::kOk;
          call_status = solveLpSimplex(solver_object);
          return_status = interpretCallStatus(options.log_options, call_status,
                                              return_status, "solveLpSimplex");
          if (return_status == HighsStatus::kError) return return_status;
          if (!isSolutionRightSize(solver_object.lp_,
                                   solver_object.solution_)) {
            highsLogUser(options.log_options, HighsLogType::kError,
                         "Inconsistent solution returned from solver\n");
            return HighsStatus::kError;
          }
        }  // options.run_crossover == kHighsOnString
           // clang-format off
      }  // unwelcome_ipx_status
      // clang-format on
    } else {
      // PDLP has been used, so check whether claim of optimality
      // satisfies the HiGHS criteria
      //
      // Even when PDLP terminates with primal and dual feasibility
      // and duality gap that are within the tolerances supplied by
      // HiGHS, the HiGHS primal and dual feasibility tolerances may
      // not be satisfied since they are absolute, and in PDLP they
      // are relative. Note that, even when only one PDLP row activity
      // fails to satisfy the absolute tolerance, the absolute norm
      // measure reported by PDLP will not necessarily be the same as
      // with HiGHS, since PDLP uses the 2-norm, and HiGHS the
      // infinity- and 1-norm
      //
      // A single small HiGHS primal infeasibility from PDLP can yield
      // a significant dual infeasibility, since the variable is
      // interpreted as being off its bound so any dual value is an
      // infeasibility. Hence, for context, the max and sum of
      // complementarity violations are also computed.
      const HighsInfo& info = solver_object.highs_info_;
      if (solver_object.model_status_ == HighsModelStatus::kOptimal) {
        if (info.num_primal_infeasibilities || info.num_dual_infeasibilities) {
          if (info.num_primal_infeasibilities) {
            highsLogUser(options.log_options, HighsLogType::kWarning,
                         "PDLP claims optimality, but with num/max/sum %d / "
                         "%9.4g / %9.4g primal infeasibilities\n",
                         int(info.num_primal_infeasibilities),
                         info.max_primal_infeasibility,
                         info.sum_primal_infeasibilities);
          } else if (info.num_dual_infeasibilities) {
            highsLogUser(options.log_options, HighsLogType::kWarning,
                         "PDLP claims optimality, but with num/max/sum %d / "
                         "%9.4g / %9.4g dual infeasibilities\n",
                         int(info.num_dual_infeasibilities),
                         info.max_dual_infeasibility,
                         info.sum_dual_infeasibilities);
          }
          highsLogUser(options.log_options, HighsLogType::kWarning,
                       "                        and          max/sum     %9.4g "
                       "/ %9.4g complementarity violations\n",
                       info.max_complementarity_violation,
                       info.sum_complementarity_violations);
          highsLogUser(
              options.log_options, HighsLogType::kWarning,
              "                        so set model status to \"unknown\"\n");
          solver_object.model_status_ = HighsModelStatus::kUnknown;
        }
      } else if (solver_object.model_status_ ==
                 HighsModelStatus::kUnboundedOrInfeasible) {
        if (info.num_primal_infeasibilities == 0)
          solver_object.model_status_ = HighsModelStatus::kUnbounded;
      }
    }
  } else {
    // Use Simplex
    call_status = solveLpSimplex(solver_object);
    return_status = interpretCallStatus(options.log_options, call_status,
                                        return_status, "solveLpSimplex");
    if (return_status == HighsStatus::kError) return return_status;
    if (!isSolutionRightSize(solver_object.lp_, solver_object.solution_)) {
      highsLogUser(options.log_options, HighsLogType::kError,
                   "Inconsistent solution returned from solver\n");
      return HighsStatus::kError;
    }
  }
  // Analyse the HiGHS (basic) solution
  if (debugHighsLpSolution(message, solver_object) ==
      HighsDebugStatus::kLogicalError)
    return_status = HighsStatus::kError;
  return return_status;
}